

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O2

String * MathML::StringUtil::replaceAll
                   (String *__return_storage_ptr__,String *str,String *pattern,String *replacement)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)pattern);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,(string *)pattern->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtil::replaceAll( const String& str, const String& pattern, const String& replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string.replace( position, pattern.size(), replacement );
            position = string.find( pattern );
        }

        return string;
    }